

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
* __thiscall
chaiscript::detail::Dispatch_Engine::get_function_objects_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
           *__return_storage_ptr__,Dispatch_Engine *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppVar3;
  pointer pcVar4;
  pointer ppVar5;
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  unique_lock<chaiscript::detail::threading::shared_mutex> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  local_60;
  
  local_70._M_owns = false;
  local_70._M_device = &this->m_mutex;
  std::unique_lock<chaiscript::detail::threading::shared_mutex>::lock(&local_70);
  local_70._M_owns = true;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar5 = (this->m_state).m_function_objects.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->m_state).m_function_objects.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar3) {
    paVar2 = &local_60.first.field_2;
    do {
      const_var_impl<chaiscript::dispatch::Proxy_Function_Base>((detail *)&local_88,&ppVar5->second)
      ;
      pcVar4 = (ppVar5->first)._M_dataplus._M_p;
      local_60.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar4,pcVar4 + (ppVar5->first)._M_string_length);
      local_60.second.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_88;
      local_60.second.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Stack_80;
      local_88 = (element_type *)0x0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                  *)__return_storage_ptr__,&local_60);
      if (local_60.second.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.second.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_60.first._M_dataplus._M_p,
                        local_60.first.field_2._M_allocated_capacity + 1);
      }
      if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar3);
  }
  std::unique_lock<chaiscript::detail::threading::shared_mutex>::~unique_lock(&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, Boxed_Value> get_function_objects() const
        {
          chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

          const auto &funs = get_function_objects_int();

          std::map<std::string, Boxed_Value> objs;

          for (const auto & fun : funs)
          {
            objs.insert(std::make_pair(fun.first, const_var(fun.second)));
          }

          return objs;
        }